

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O0

semantics_t * tchecker::zg::semantics_factory(semantics_type_t semantics)

{
  invalid_argument *this;
  semantics_t *psStack_10;
  semantics_type_t semantics_local;
  
  if (semantics == STANDARD_SEMANTICS) {
    psStack_10 = (semantics_t *)operator_new(8);
    memset(psStack_10,0,8);
    standard_semantics_t::standard_semantics_t((standard_semantics_t *)psStack_10);
  }
  else {
    if (semantics != ELAPSED_SEMANTICS) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Unknown zone semantics");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    psStack_10 = (semantics_t *)operator_new(8);
    memset(psStack_10,0,8);
    elapsed_semantics_t::elapsed_semantics_t((elapsed_semantics_t *)psStack_10);
  }
  return psStack_10;
}

Assistant:

tchecker::zg::semantics_t * semantics_factory(enum semantics_type_t semantics)
{
  switch (semantics) {
  case tchecker::zg::STANDARD_SEMANTICS:
    return new tchecker::zg::standard_semantics_t{};
  case tchecker::zg::ELAPSED_SEMANTICS:
    return new tchecker::zg::elapsed_semantics_t{};
  default:
    throw std::invalid_argument("Unknown zone semantics");
  }
}